

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<QScriptItem>::emplace<QScriptItem_const&>
          (QPodArrayOps<QScriptItem> *this,qsizetype i,QScriptItem *args)

{
  QScriptItem **ppQVar1;
  qsizetype *pqVar2;
  int iVar3;
  Data *pDVar4;
  long lVar5;
  undefined8 uVar6;
  QScriptItem *pQVar7;
  int iVar8;
  QScriptAnalysis QVar9;
  unsigned_short uVar10;
  undefined2 uVar11;
  QFixed QVar12;
  QFixed QVar13;
  QFixed QVar14;
  QFixed QVar15;
  QScriptItem *pQVar16;
  GrowthPosition where;
  
  pDVar4 = (this->super_QArrayDataPointer<QScriptItem>).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0050fb97:
    uVar10 = args->num_glyphs;
    uVar11 = *(undefined2 *)&args->field_0xa;
    iVar3 = args->glyph_data_offset;
    QVar12.val = (args->descent).val;
    QVar13.val = (args->ascent).val;
    QVar14.val = (args->leading).val;
    QVar15.val = (args->width).val;
    iVar8 = args->position;
    QVar9 = args->analysis;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QScriptItem>).size != 0);
    QArrayDataPointer<QScriptItem>::detachAndGrow
              (&this->super_QArrayDataPointer<QScriptItem>,where,1,(QScriptItem **)0x0,
               (QArrayDataPointer<QScriptItem> *)0x0);
    pQVar16 = createHole(this,where,i,1);
    pQVar16->position = iVar8;
    pQVar16->analysis = QVar9;
    pQVar16->num_glyphs = uVar10;
    *(undefined2 *)&pQVar16->field_0xa = uVar11;
    pQVar16->descent = (QFixed)QVar12.val;
    pQVar16->ascent = (QFixed)QVar13.val;
    pQVar16->leading = (QFixed)QVar14.val;
    pQVar16->width = (QFixed)QVar15.val;
    pQVar16->glyph_data_offset = iVar3;
  }
  else {
    lVar5 = (this->super_QArrayDataPointer<QScriptItem>).size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc !=
        ((long)((long)(this->super_QArrayDataPointer<QScriptItem>).ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
        lVar5)) {
      pQVar16 = (this->super_QArrayDataPointer<QScriptItem>).ptr;
      iVar3 = args->position;
      QVar9 = args->analysis;
      uVar10 = args->num_glyphs;
      uVar11 = *(undefined2 *)&args->field_0xa;
      QVar13.val = (args->descent).val;
      QVar12.val = (args->leading).val;
      uVar6 = *(undefined8 *)&args->width;
      pQVar7 = pQVar16 + lVar5;
      pQVar7->ascent = (QFixed)(args->ascent).val;
      pQVar7->leading = (QFixed)QVar12.val;
      *(undefined8 *)(&pQVar7->ascent + 2) = uVar6;
      pQVar16 = pQVar16 + lVar5;
      pQVar16->position = iVar3;
      pQVar16->analysis = QVar9;
      pQVar16->num_glyphs = uVar10;
      *(undefined2 *)&pQVar16->field_0xa = uVar11;
      pQVar16->descent = (QFixed)QVar13.val;
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((QScriptItem *)
          ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QScriptItem>).ptr)) goto LAB_0050fb97;
      pQVar16 = (this->super_QArrayDataPointer<QScriptItem>).ptr;
      iVar8 = args->position;
      QVar9 = args->analysis;
      uVar10 = args->num_glyphs;
      uVar11 = *(undefined2 *)&args->field_0xa;
      QVar14.val = (args->descent).val;
      QVar12.val = (args->leading).val;
      QVar13.val = (args->width).val;
      iVar3 = args->glyph_data_offset;
      pQVar16[-1].ascent = (QFixed)(args->ascent).val;
      pQVar16[-1].leading = (QFixed)QVar12.val;
      pQVar16[-1].width = (QFixed)QVar13.val;
      pQVar16[-1].glyph_data_offset = iVar3;
      pQVar16[-1].position = iVar8;
      pQVar16[-1].analysis = QVar9;
      pQVar16[-1].num_glyphs = uVar10;
      *(undefined2 *)&pQVar16[-1].field_0xa = uVar11;
      pQVar16[-1].descent = (QFixed)QVar14.val;
      ppQVar1 = &(this->super_QArrayDataPointer<QScriptItem>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QScriptItem>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }